

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  double dVar5;
  uint uVar6;
  ImGuiContext *pIVar7;
  ImGuiWindow *pIVar8;
  ImGuiWindow *pIVar9;
  byte bVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  ImGuiWindow *pIVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  
  pIVar7 = GImGui;
  pIVar20 = GImGui->MovingWindow;
  pIVar8 = (ImGuiWindow *)0x0;
  if ((pIVar20 != (ImGuiWindow *)0x0) && ((pIVar20->Flags & 0x200) == 0)) {
    pIVar8 = pIVar20;
  }
  IVar4 = (GImGui->Style).TouchExtraPadding;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = IVar4.x;
  auVar22._4_4_ = IVar4.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar22 = maxps(auVar22,_DAT_00192bc0);
    lVar12 = auVar22._0_8_;
  }
  else {
    lVar12 = ((ulong)(uint)IVar4.y << 0x20) + ((ulong)IVar4 & 0xffffffff);
  }
  lVar13 = (long)(GImGui->Windows).Size;
  if (0 < lVar13) {
    uVar14 = lVar13 + 1;
    do {
      pIVar20 = (GImGui->Windows).Data[uVar14 - 2];
      if (((pIVar20->Active == true) && (pIVar20->Hidden == false)) &&
         (uVar6 = pIVar20->Flags, (uVar6 >> 9 & 1) == 0)) {
        fVar18 = (float)lVar12;
        if ((uVar6 & 0x1000002) != 0) {
          fVar18 = IVar4.x;
        }
        fVar2 = (GImGui->IO).MousePos.x;
        if ((pIVar20->OuterRectClipped).Min.x - fVar18 <= fVar2) {
          fVar19 = (float)((ulong)lVar12 >> 0x20);
          if ((uVar6 & 0x1000002) != 0) {
            fVar19 = IVar4.y;
          }
          fVar3 = (GImGui->IO).MousePos.y;
          if ((((pIVar20->OuterRectClipped).Min.y - fVar19 <= fVar3) &&
              (fVar2 < fVar18 + (pIVar20->OuterRectClipped).Max.x)) &&
             (fVar3 < fVar19 + (pIVar20->OuterRectClipped).Max.y)) {
            if (pIVar8 != (ImGuiWindow *)0x0) {
              pIVar20 = pIVar8;
            }
            if (pIVar20 != (ImGuiWindow *)0x0) {
              GImGui->HoveredWindow = pIVar20;
              goto LAB_0011f8c3;
            }
            pIVar8 = (ImGuiWindow *)0x0;
          }
        }
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  GImGui->HoveredWindow = pIVar8;
  pIVar20 = pIVar8;
  if (pIVar8 == (ImGuiWindow *)0x0) {
    pIVar20 = (ImGuiWindow *)0x0;
    pIVar8 = (ImGuiWindow *)0x0;
  }
  else {
LAB_0011f8c3:
    pIVar8 = pIVar20->RootWindow;
  }
  pIVar7->HoveredRootWindow = pIVar8;
  pIVar9 = GetFrontMostPopupModal();
  if (((pIVar9 != (ImGuiWindow *)0x0) && (pIVar8 != (ImGuiWindow *)0x0)) &&
     (pIVar8->RootWindow != pIVar9)) {
    do {
      if (pIVar8 == pIVar9) goto LAB_0011f911;
      pIVar8 = pIVar8->ParentWindow;
    } while (pIVar8 != (ImGuiWindow *)0x0);
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar20 = (ImGuiWindow *)0x0;
  }
LAB_0011f911:
  uVar6 = (pIVar7->IO).ConfigFlags;
  if ((uVar6 & 0x10) != 0) {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar20 = (ImGuiWindow *)0x0;
  }
  iVar17 = -1;
  lVar12 = 0;
  bVar10 = 0;
  do {
    if ((pIVar7->IO).MouseClicked[lVar12] == true) {
      bVar21 = true;
      if (pIVar20 == (ImGuiWindow *)0x0) {
        bVar21 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[lVar12] = bVar21;
    }
    bVar21 = (pIVar7->IO).MouseDown[lVar12];
    if (bVar21 == true) {
      if (iVar17 != -1) {
        dVar5 = (pIVar7->IO).MouseClickedTime[iVar17];
        pdVar1 = (pIVar7->IO).MouseClickedTime + lVar12;
        if (dVar5 < *pdVar1 || dVar5 == *pdVar1) goto LAB_0011f98e;
      }
      iVar17 = (int)lVar12;
    }
LAB_0011f98e:
    bVar10 = bVar10 & 1 | bVar21;
    lVar12 = lVar12 + 1;
    if (lVar12 == 5) {
      if (iVar17 == -1) {
        bVar15 = 1;
      }
      else {
        bVar15 = (pIVar7->IO).MouseDownOwned[iVar17];
      }
      if (pIVar7->DragDropActive == true) {
        bVar16 = ((byte)pIVar7->DragDropSourceFlags & 0x10) >> 4;
      }
      else {
        bVar16 = 0;
      }
      if (bVar16 == 0 && (bVar15 & 1) == 0) {
        pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar20 = (ImGuiWindow *)0x0;
      }
      if (pIVar7->WantCaptureMouseNextFrame == -1) {
        bVar21 = true;
        if ((bVar15 & (pIVar20 != (ImGuiWindow *)0x0 || bVar10 != 0)) == 0) {
          bVar21 = (pIVar7->OpenPopupStack).Size != 0;
        }
        (pIVar7->IO).WantCaptureMouse = bVar21;
      }
      else {
        (pIVar7->IO).WantCaptureMouse = pIVar7->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar7->WantCaptureKeyboardNextFrame == -1) {
        bVar21 = pIVar7->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
      }
      else {
        bVar21 = pIVar7->WantCaptureKeyboardNextFrame != 0;
      }
      bVar11 = true;
      if ((pIVar7->IO).NavActive == false) {
        bVar11 = bVar21;
      }
      if ((uVar6 & 9) != 1) {
        bVar11 = bVar21;
      }
      (pIVar7->IO).WantCaptureKeyboard = bVar11;
      (pIVar7->IO).WantTextInput = pIVar7->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
  } while( true );
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to imgui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to imgui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}